

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int ParseEXRHeaderFromMemory
              (EXRHeader *exr_header,EXRVersion *version,uchar *memory,size_t size,char **err)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  string err_str;
  string err_str_1;
  HeaderInfo info;
  string local_138;
  string local_118;
  undefined1 local_f8 [24];
  pointer pTStack_e0;
  pointer local_d8;
  pointer pTStack_d0;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (exr_header == (EXRHeader *)0x0 || memory == (uchar *)0x0) {
    local_f8._0_8_ = (pointer)(local_f8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,
               "Invalid argument. `memory` or `exr_header` argument is null in ParseEXRHeaderFromMemory()"
               ,"");
    if (err != (char **)0x0) {
      pcVar3 = strdup((char *)local_f8._0_8_);
      *err = pcVar3;
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_);
    }
    iVar2 = -3;
  }
  else if (size < 8) {
    local_f8._0_8_ = (pointer)(local_f8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"Insufficient header/data size.\n","");
    if (err != (char **)0x0) {
      pcVar3 = strdup((char *)local_f8._0_8_);
      *err = pcVar3;
    }
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_);
    }
    iVar2 = -4;
  }
  else {
    local_70._M_p = (pointer)&local_60;
    local_d8 = (pointer)0x0;
    pTStack_d0 = (pointer)0x0;
    local_f8._16_8_ = (pointer)0x0;
    pTStack_e0 = (pointer)0x0;
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    tinyexr::HeaderInfo::clear((HeaderInfo *)local_f8);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    iVar2 = tinyexr::ParseEXRHeader
                      ((HeaderInfo *)local_f8,(bool *)0x0,version,&local_138,memory + 8,size - 8);
    if (((err != (char **)0x0) && (iVar2 != 0)) && (local_138._M_string_length != 0)) {
      pcVar3 = strdup(local_138._M_dataplus._M_p);
      *err = pcVar3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    bVar1 = tinyexr::ConvertHeader(exr_header,(HeaderInfo *)local_f8,&local_138,&local_118);
    if (!bVar1) {
      if (local_d8 != pTStack_e0) {
        lVar5 = 0x200;
        uVar4 = 0;
        do {
          if (*(void **)(pTStack_e0->name + lVar5) != (void *)0x0) {
            free(*(void **)(pTStack_e0->name + lVar5));
          }
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0x210;
        } while (uVar4 < (ulong)(((long)local_d8 - (long)pTStack_e0 >> 4) * 0xf83e0f83e0f83e1));
      }
      iVar2 = -9;
      if ((err != (char **)0x0) && (local_118._M_string_length != 0)) {
        pcVar3 = strdup(local_118._M_dataplus._M_p);
        *err = pcVar3;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    exr_header->multipart = (uint)(version->multipart != 0);
    exr_header->non_image = (uint)(version->non_image != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p);
    }
    if (pTStack_e0 != (pointer)0x0) {
      operator_delete(pTStack_e0);
    }
    std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::~vector
              ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)local_f8);
  }
  return iVar2;
}

Assistant:

int ParseEXRHeaderFromMemory(EXRHeader *exr_header, const EXRVersion *version,
                             const unsigned char *memory, size_t size,
                             const char **err) {
  if (memory == NULL || exr_header == NULL) {
    tinyexr::SetErrorMessage(
        "Invalid argument. `memory` or `exr_header` argument is null in "
        "ParseEXRHeaderFromMemory()",
        err);

    // Invalid argument
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (size < tinyexr::kEXRVersionSize) {
    tinyexr::SetErrorMessage("Insufficient header/data size.\n", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }

  const unsigned char *marker = memory + tinyexr::kEXRVersionSize;
  size_t marker_size = size - tinyexr::kEXRVersionSize;

  tinyexr::HeaderInfo info;
  info.clear();

  int ret;
  {
    std::string err_str;
    ret = ParseEXRHeader(&info, NULL, version, &err_str, marker, marker_size);

    if (ret != TINYEXR_SUCCESS) {
      if (err && !err_str.empty()) {
        tinyexr::SetErrorMessage(err_str, err);
      }
    }
  }

  {
    std::string warn;
    std::string err_str;

    if (!ConvertHeader(exr_header, info, &warn, &err_str)) {
      // release mem
      for (size_t i = 0; i < info.attributes.size(); i++) {
        if (info.attributes[i].value) {
          free(info.attributes[i].value);
        }
      }
      if (err && !err_str.empty()) {
        tinyexr::SetErrorMessage(err_str, err);
      }
      ret = TINYEXR_ERROR_INVALID_HEADER;
    }
  }

  exr_header->multipart = version->multipart ? 1 : 0;
  exr_header->non_image = version->non_image ? 1 : 0;

  return ret;
}